

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O3

int __thiscall Imf_3_4::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  BaseExc *this_00;
  char cVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  size_t outSize;
  int local_28 [2];
  
  pcVar6 = this->_tmpBuffer;
  lVar5 = (long)rawSize;
  if (0 < rawSize) {
    pcVar7 = raw + lVar5;
    do {
      *pcVar6 = *raw;
      if (pcVar7 <= raw + 1) break;
      pcVar6[rawSize + 1U >> 1] = raw[1];
      pcVar6 = pcVar6 + 1;
      raw = raw + 2;
    } while (raw < pcVar7);
    pcVar6 = this->_tmpBuffer;
    if (rawSize != 1) {
      pcVar7 = pcVar6 + 1;
      cVar4 = *pcVar6;
      do {
        cVar1 = *pcVar7;
        *pcVar7 = (cVar1 - cVar4) + -0x80;
        pcVar7 = pcVar7 + 1;
        cVar4 = cVar1;
      } while (pcVar7 < pcVar6 + lVar5);
      pcVar6 = this->_tmpBuffer;
    }
  }
  iVar2 = this->_zipLevel;
  uVar3 = exr_compress_max_buffer_size(this->_maxRawSize);
  iVar2 = exr_compress_buffer(0,iVar2,pcVar6,lVar5,compressed,uVar3,local_28);
  if (iVar2 == 0) {
    return local_28[0];
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::BaseExc::BaseExc(this_00,"Data compression failed.");
  __cxa_throw(this_00,&Iex_3_4::BaseExc::typeinfo,Iex_3_4::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress (const char* raw, int rawSize, char* compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char*       t1   = _tmpBuffer;
        char*       t2   = _tmpBuffer + (rawSize + 1) / 2;
        const char* stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
                *(t1++) = *(raw++);
            else
                break;

            if (raw < stop)
                *(t2++) = *(raw++);
            else
                break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char* t    = (unsigned char*) _tmpBuffer + 1;
        unsigned char* stop = (unsigned char*) _tmpBuffer + rawSize;
        int            p    = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p     = t[0];
            t[0]  = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //
    size_t outSize;
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
                               nullptr,
                               _zipLevel,
                               _tmpBuffer,
                               rawSize,
                               compressed,
                               maxCompressedSize (),
                               &outSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression failed.");
    }

    return outSize;
}